

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O3

Vec_Str_t * Gia_ManIsoFindString(Gia_Man_t *p,int iPo,int fVerbose,Vec_Int_t **pvPiPerm)

{
  int iVar1;
  int iVar2;
  void **__ptr;
  void *__ptr_00;
  Gia_Man_t *p_00;
  Vec_Ptr_t *__ptr_01;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Vec_Int_t *vAnds;
  Vec_Int_t *vCos;
  Vec_Str_t *pVVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int local_34;
  
  local_34 = iPo;
  p_00 = Gia_ManDupCones(p,&local_34,1,1);
  if (p_00->vCos->nSize - p_00->nRegs != 1) {
    __assert_fail("Gia_ManPoNum(pPart) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                  ,0x3ef,"Vec_Str_t *Gia_ManIsoFindString(Gia_Man_t *, int, int, Vec_Int_t **)");
  }
  if (p_00->vCis->nSize == 0) {
    if (p_00->nObjs != 2) {
      __assert_fail("Gia_ManObjNum(pPart) == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                    ,0x3f3,"Vec_Str_t *Gia_ManIsoFindString(Gia_Man_t *, int, int, Vec_Int_t **)");
    }
    pVVar5 = Gia_AigerWriteIntoMemoryStr(p_00);
    Gia_ManStop(p_00);
    if (pvPiPerm == (Vec_Int_t **)0x0) {
      return pVVar5;
    }
    pVVar3 = (Vec_Int_t *)calloc(1,0x10);
    *pvPiPerm = pVVar3;
    return pVVar5;
  }
  __ptr_01 = Gia_IsoDeriveEquivPos(p_00,0,fVerbose);
  if (__ptr_01 == (Vec_Ptr_t *)0x0) goto LAB_007539f4;
  iVar7 = __ptr_01->nSize;
  __ptr = __ptr_01->pArray;
  if ((long)iVar7 < 1) {
    if (__ptr != (void **)0x0) goto LAB_007539e4;
  }
  else {
    lVar8 = 0;
    do {
      __ptr_00 = __ptr[lVar8];
      if (__ptr_00 != (void *)0x0) {
        if (*(void **)((long)__ptr_00 + 8) != (void *)0x0) {
          free(*(void **)((long)__ptr_00 + 8));
        }
        free(__ptr_00);
      }
      lVar8 = lVar8 + 1;
    } while (iVar7 != lVar8);
LAB_007539e4:
    free(__ptr);
  }
  free(__ptr_01);
LAB_007539f4:
  iVar7 = p_00->vCis->nSize;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar6 = iVar7;
  if (iVar7 - 1U < 0xf) {
    iVar6 = 0x10;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar6;
  if (iVar6 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar6 << 2);
  }
  pVVar3->pArray = piVar4;
  iVar1 = p_00->nObjs;
  iVar2 = p_00->vCos->nSize;
  iVar6 = ~(iVar7 + iVar2) + iVar1;
  vAnds = (Vec_Int_t *)malloc(0x10);
  if ((~(iVar7 + iVar2) + iVar1) - 1U < 0xf) {
    iVar6 = 0x10;
  }
  vAnds->nSize = 0;
  vAnds->nCap = iVar6;
  if (iVar6 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar6 << 2);
  }
  vAnds->pArray = piVar4;
  vCos = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar7 = iVar2;
  }
  vCos->nSize = 0;
  vCos->nCap = iVar7;
  if (iVar7 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar7 << 2);
  }
  vCos->pArray = piVar4;
  Gia_ManFindCaninicalOrder(p_00,pVVar3,vAnds,vCos,pvPiPerm);
  pVVar5 = Gia_AigerWriteIntoMemoryStrPart(p_00,pVVar3,vAnds,vCos,p_00->nRegs);
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
  }
  free(pVVar3);
  if (vAnds->pArray != (int *)0x0) {
    free(vAnds->pArray);
  }
  free(vAnds);
  if (vCos->pArray != (int *)0x0) {
    free(vCos->pArray);
  }
  free(vCos);
  Gia_ManStop(p_00);
  return pVVar5;
}

Assistant:

Vec_Str_t * Gia_ManIsoFindString( Gia_Man_t * p, int iPo, int fVerbose, Vec_Int_t ** pvPiPerm )
{
    Gia_Man_t * pPart;
    Vec_Ptr_t * vEquiv;
    Vec_Int_t * vCis, * vAnds, * vCos;
    Vec_Str_t * vStr;
    // duplicate
    pPart = Gia_ManDupCones( p, &iPo, 1, 1 );
//Gia_ManPrint( pPart );
    assert( Gia_ManPoNum(pPart) == 1 );
    if ( Gia_ManCiNum(pPart) == 0 ) // const AIG
    {
        assert( Gia_ManPoNum(pPart) == 1 );
        assert( Gia_ManObjNum(pPart) == 2 );
        vStr = Gia_AigerWriteIntoMemoryStr( pPart );
        Gia_ManStop( pPart );
        if ( pvPiPerm )
            *pvPiPerm = Vec_IntAlloc( 0 );
        return vStr;
    }
    // derive canonical values
    vEquiv = Gia_IsoDeriveEquivPos( pPart, 0, fVerbose );
    Vec_VecFreeP( (Vec_Vec_t **)&vEquiv );
    // find canonical order
    vCis  = Vec_IntAlloc( Gia_ManCiNum(pPart) );
    vAnds = Vec_IntAlloc( Gia_ManAndNum(pPart) );
    vCos  = Vec_IntAlloc( Gia_ManCoNum(pPart) );
    Gia_ManFindCaninicalOrder( pPart, vCis, vAnds, vCos, pvPiPerm );
//printf( "Internal: " );
//Vec_IntPrint( vCis );
    // derive the AIGER string
    vStr = Gia_AigerWriteIntoMemoryStrPart( pPart, vCis, vAnds, vCos, Gia_ManRegNum(pPart) );
    // cleanup
    Vec_IntFree( vCis );
    Vec_IntFree( vAnds );
    Vec_IntFree( vCos );
    Gia_ManStop( pPart );
    return vStr;
}